

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.cxx
# Opt level: O0

bool __thiscall
cmUtilitySourceCommand::InitialPass
          (cmUtilitySourceCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  uint uVar3;
  size_type sVar4;
  string *psVar5;
  char *pcVar6;
  reference pbVar7;
  reference __rhs;
  ulong uVar8;
  bool local_3d2;
  bool local_3d1;
  allocator<char> local_381;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  string utilityExecutable;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  string local_250 [8];
  string exePath;
  string utilityDirectory;
  string local_208;
  string *local_1e8;
  string *cmakeCFGout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string utilitySource;
  string *relativeSource;
  reference local_110;
  string *utilityName;
  cmState *state;
  undefined1 local_f8 [8];
  string msg;
  string local_d0;
  bool local_aa;
  allocator<char> local_a9;
  undefined1 local_a8 [6];
  bool haveCacheValue;
  string *local_88;
  string *intDir;
  char *cacheValue;
  reference local_70;
  string *cacheEntry;
  const_iterator arg;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmUtilitySourceCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar4 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    this_local._7_1_ = 0;
    goto LAB_00379662;
  }
  cacheEntry = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
  cacheValue = (char *)__gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&cacheEntry,0);
  local_70 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&cacheValue);
  intDir = (string *)cmMakefile::GetDefinition((this->super_cmCommand).Makefile,local_70);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"CMAKE_CFG_INTDIR",&local_a9);
  psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_aa = false;
  pcVar1 = (this->super_cmCommand).Makefile;
  local_88 = psVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"CMAKE_CROSSCOMPILING",
             (allocator<char> *)(msg.field_2._M_local_buf + 0xf));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
  if (bVar2) {
    local_aa = intDir != (string *)0x0;
    if (!local_aa) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"UTILITY_SOURCE is used in cross compiling mode for ",
                 (allocator<char> *)((long)&state + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&state + 7));
      std::__cxx11::string::operator+=((string *)local_f8,(string *)local_70);
      std::__cxx11::string::operator+=
                ((string *)local_f8,
                 ". If your intention is to run this executable, you need to preload the cache with the full path to a version of that program, which runs on this build machine."
                );
      cmSystemTools::Message((string *)local_f8,"Warning");
      std::__cxx11::string::~string((string *)local_f8);
    }
  }
  else {
    utilityName = (string *)cmMakefile::GetState((this->super_cmCommand).Makefile);
    local_3d1 = false;
    if (intDir != (string *)0x0) {
      pcVar6 = strstr((char *)intDir,"(IntDir)");
      if (pcVar6 != (char *)0x0) {
        bVar2 = std::operator==(local_88,"$(IntDir)");
        local_3d1 = false;
        if (!bVar2) goto LAB_00378dbb;
      }
      uVar3 = cmState::GetCacheMajorVersion((cmState *)utilityName);
      local_3d2 = false;
      if (uVar3 != 0) {
        uVar3 = cmState::GetCacheMinorVersion((cmState *)utilityName);
        local_3d2 = uVar3 != 0;
      }
      local_3d1 = local_3d2;
    }
LAB_00378dbb:
    local_aa = local_3d1;
  }
  if ((local_aa & 1U) == 0) {
    relativeSource =
         (string *)
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    local_110 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&relativeSource);
    utilitySource.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&cacheEntry,0);
    pbVar7 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&utilitySource.field_2 + 8));
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)local_148,(string *)psVar5);
    std::operator+(&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "/");
    std::operator+(&local_168,&local_188,pbVar7);
    std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    bVar2 = cmsys::SystemTools::FileExists((string *)local_148);
    if (bVar2) {
      do {
        file.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&cacheEntry,
                           (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&file.field_2 + 8));
        if (!bVar2) {
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"CMAKE_CFG_INTDIR",
                     (allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          psVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_208);
          std::__cxx11::string::~string((string *)&local_208);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(utilityDirectory.field_2._M_local_buf + 0xf));
          local_1e8 = psVar5;
          psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                             ((this->super_cmCommand).Makefile);
          std::__cxx11::string::string
                    ((string *)(exePath.field_2._M_local_buf + 8),(string *)psVar5);
          std::__cxx11::string::string(local_250);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"EXECUTABLE_OUTPUT_PATH",&local_271);
          pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          if (pcVar6 != (char *)0x0) {
            pcVar1 = (this->super_cmCommand).Makefile;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_298,"EXECUTABLE_OUTPUT_PATH",&local_299);
            pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_298);
            std::__cxx11::string::operator=(local_250,pcVar6);
            std::__cxx11::string::~string((string *)&local_298);
            std::allocator<char>::~allocator(&local_299);
          }
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::__cxx11::string::operator=((string *)(exePath.field_2._M_local_buf + 8),local_250);
          }
          else {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&utilityExecutable.field_2 + 8),"/",pbVar7);
            std::__cxx11::string::operator+=
                      ((string *)(exePath.field_2._M_local_buf + 8),
                       (string *)(utilityExecutable.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(utilityExecutable.field_2._M_local_buf + 8));
          }
          std::operator+(&local_360,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&exePath.field_2 + 8),"/");
          std::operator+(&local_340,&local_360,local_1e8);
          std::operator+(&local_320,&local_340,"/");
          std::operator+(&local_300,&local_320,local_110);
          pcVar1 = (this->super_cmCommand).Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_380,"CMAKE_EXECUTABLE_SUFFIX",&local_381);
          pcVar6 = cmMakefile::GetDefinition(pcVar1,&local_380);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2e0,&local_300,pcVar6);
          std::__cxx11::string::~string((string *)&local_380);
          std::allocator<char>::~allocator(&local_381);
          std::__cxx11::string::~string((string *)&local_300);
          std::__cxx11::string::~string((string *)&local_320);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          cmsys::SystemTools::ReplaceString((string *)local_2e0,"/./","/");
          pbVar7 = local_70;
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,pbVar7,pcVar6,"Path to an internal program.",FILEPATH,false);
          cmsys::SystemTools::ConvertToUnixSlashes((string *)local_2e0);
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmMakefile::AddCacheDefinition
                    (pcVar1,(string *)local_2e0,pcVar6,"Executable to project name.",INTERNAL,false)
          ;
          this_local._7_1_ = 1;
          std::__cxx11::string::~string((string *)local_2e0);
          std::__cxx11::string::~string(local_250);
          std::__cxx11::string::~string((string *)(exePath.field_2._M_local_buf + 8));
          break;
        }
        std::operator+(&local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148,"/");
        cmakeCFGout = (string *)
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&cacheEntry,0);
        __rhs = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&cmakeCFGout);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&local_1d8,__rhs);
        std::__cxx11::string::~string((string *)&local_1d8);
        bVar2 = cmsys::SystemTools::FileExists((string *)local_1b8);
        if (!bVar2) {
          this_local._7_1_ = 1;
        }
        std::__cxx11::string::~string((string *)local_1b8);
      } while (bVar2);
    }
    else {
      this_local._7_1_ = 1;
    }
    std::__cxx11::string::~string((string *)local_148);
  }
  else {
    this_local._7_1_ = 1;
  }
LAB_00379662:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmUtilitySourceCommand::InitialPass(std::vector<std::string> const& args,
                                         cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  std::vector<std::string>::const_iterator arg = args.begin();

  // The first argument is the cache entry name.
  std::string const& cacheEntry = *arg++;
  const char* cacheValue = this->Makefile->GetDefinition(cacheEntry);
  // If it exists already and appears up to date then we are done.  If
  // the string contains "(IntDir)" but that is not the
  // CMAKE_CFG_INTDIR setting then the value is out of date.
  std::string const& intDir =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");

  bool haveCacheValue = false;
  if (this->Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
    haveCacheValue = (cacheValue != nullptr);
    if (!haveCacheValue) {
      std::string msg = "UTILITY_SOURCE is used in cross compiling mode for ";
      msg += cacheEntry;
      msg += ". If your intention is to run this executable, you need to "
             "preload the cache with the full path to a version of that "
             "program, which runs on this build machine.";
      cmSystemTools::Message(msg, "Warning");
    }
  } else {
    cmState* state = this->Makefile->GetState();
    haveCacheValue = (cacheValue &&
                      (strstr(cacheValue, "(IntDir)") == nullptr ||
                       (intDir == "$(IntDir)")) &&
                      (state->GetCacheMajorVersion() != 0 &&
                       state->GetCacheMinorVersion() != 0));
  }

  if (haveCacheValue) {
    return true;
  }

  // The second argument is the utility's executable name, which will be
  // needed later.
  std::string const& utilityName = *arg++;

  // The third argument specifies the relative directory of the source
  // of the utility.
  std::string const& relativeSource = *arg++;
  std::string utilitySource = this->Makefile->GetCurrentSourceDirectory();
  utilitySource = utilitySource + "/" + relativeSource;

  // If the directory doesn't exist, the source has not been included.
  if (!cmSystemTools::FileExists(utilitySource)) {
    return true;
  }

  // Make sure all the files exist in the source directory.
  while (arg != args.end()) {
    std::string file = utilitySource + "/" + *arg++;
    if (!cmSystemTools::FileExists(file)) {
      return true;
    }
  }

  // The source exists.
  const std::string& cmakeCFGout =
    this->Makefile->GetRequiredDefinition("CMAKE_CFG_INTDIR");
  std::string utilityDirectory = this->Makefile->GetCurrentBinaryDirectory();
  std::string exePath;
  if (this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH")) {
    exePath = this->Makefile->GetDefinition("EXECUTABLE_OUTPUT_PATH");
  }
  if (!exePath.empty()) {
    utilityDirectory = exePath;
  } else {
    utilityDirectory += "/" + relativeSource;
  }

  // Construct the cache entry for the executable's location.
  std::string utilityExecutable = utilityDirectory + "/" + cmakeCFGout + "/" +
    utilityName + this->Makefile->GetDefinition("CMAKE_EXECUTABLE_SUFFIX");

  // make sure we remove any /./ in the name
  cmSystemTools::ReplaceString(utilityExecutable, "/./", "/");

  // Enter the value into the cache.
  this->Makefile->AddCacheDefinition(cacheEntry, utilityExecutable.c_str(),
                                     "Path to an internal program.",
                                     cmStateEnums::FILEPATH);
  // add a value into the cache that maps from the
  // full path to the name of the project
  cmSystemTools::ConvertToUnixSlashes(utilityExecutable);
  this->Makefile->AddCacheDefinition(utilityExecutable, utilityName.c_str(),
                                     "Executable to project name.",
                                     cmStateEnums::INTERNAL);

  return true;
}